

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.c
# Opt level: O0

_Bool get_global(ch_context *context,ch_string *name)

{
  ch_primitive *pcVar1;
  ch_primitive entry;
  ch_primitive *global;
  ch_string *name_local;
  ch_context *context_local;
  
  pcVar1 = ch_table_get(&context->globals,name);
  if (pcVar1 != (ch_primitive *)0x0) {
    entry._4_4_ = 0;
    entry.type = pcVar1->type;
    entry.field_1 =
         (anon_union_8_4_dd993ae3_for_ch_primitive_1)
         (anon_union_8_4_dd993ae3_for_ch_primitive_1)(pcVar1->field_1).object_value;
    ch_stack_push(&context->stack,entry);
  }
  else {
    ch_runtime_error(context,EXIT_GLOBAL_NOT_FOUND,"Global variable does not exist: %s.",name->value
                    );
  }
  return pcVar1 != (ch_primitive *)0x0;
}

Assistant:

static bool get_global(ch_context* context, ch_string* name) {
  ch_primitive *global = ch_table_get(&context->globals, name);
  if (global == NULL) {
    ch_runtime_error(context, EXIT_GLOBAL_NOT_FOUND,
                      "Global variable does not exist: %s.", name->value);
    return false;
  }

  ch_stack_push(&context->stack, *global);
  return true;
}